

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_mqenc.c
# Opt level: O0

int jpc_mqenc_dump(jpc_mqenc_t *mqenc,FILE *out)

{
  FILE *out_local;
  jpc_mqenc_t *mqenc_local;
  
  fprintf((FILE *)out,"AREG = %08lx, CREG = %08lx, CTREG = %lu\n",mqenc->areg,mqenc->creg,
          mqenc->ctreg);
  fprintf((FILE *)out,"IND = %02ld, MPS = %d, QEVAL = %04lx\n",(long)(*mqenc->curctx + -0xb8f6) >> 5
          ,(ulong)((*mqenc->curctx)->mps & 1),(*mqenc->curctx)->qeval);
  return 0;
}

Assistant:

int jpc_mqenc_dump(const jpc_mqenc_t *mqenc, FILE *out)
{
	fprintf(out, "AREG = %08"PRIxFAST32", CREG = %08"PRIxFAST32", CTREG = %"PRIuFAST32"\n",
	  mqenc->areg, mqenc->creg, mqenc->ctreg);
	fprintf(out, "IND = %02"PRIdPTR", MPS = %d, QEVAL = %04"PRIxFAST16"\n",
	  *mqenc->curctx - jpc_mqstates, (*mqenc->curctx)->mps,
	  (*mqenc->curctx)->qeval);
	return 0;
}